

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  char *pcVar1;
  bool bVar2;
  double dVar3;
  int local_24;
  int i;
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  if (action == 1) {
    if (key == 0x54) {
      delay = (int)((delay != 0 ^ 0xffU) & 1);
      pcVar1 = "disabled";
      if (delay != 0) {
        pcVar1 = "enabled";
      }
      printf("Delay %s.\n",pcVar1);
    }
    else if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
    }
    else if (delay == 0) {
      command_callback(key);
    }
    else {
      local_24 = 0;
      while( true ) {
        bVar2 = false;
        if (local_24 < CommandCount) {
          bVar2 = commands[local_24].key != key;
        }
        if (!bVar2) break;
        local_24 = local_24 + 1;
      }
      if (local_24 < CommandCount) {
        dVar3 = glfwGetTime();
        commands[local_24].time = dVar3;
      }
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GL_TRUE);
            break;

        case GLFW_KEY_T:
            delay = !delay;
            printf("Delay %s.\n", delay ? "enabled" : "disabled");
            break;

        default:
        {
            if (delay)
            {
                int i = 0;

                while (i < CommandCount && commands[i].key != key)
                    i++;

                if (i < CommandCount)
                    commands[i].time = glfwGetTime();
            }
            else
            {
                command_callback(key);
            }
        }
        break;
    }
}